

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  ushort *puVar1;
  bool bVar2;
  java *this_00;
  bool in_R8B;
  string_view field_name;
  string_view input;
  string name;
  AlphaNum local_70;
  size_type local_40;
  pointer local_38;
  char *extraout_RDX;
  
  puVar1 = (ushort *)(descriptor->all_names_).payload_;
  this_00 = (java *)(ulong)*puVar1;
  input._M_len = (long)puVar1 + ~(ulong)this_00;
  input._M_str = (char *)0x1;
  ToCamelCase_abi_cxx11_(&name,this_00,input,in_R8B);
  field_name._M_str = extraout_RDX;
  field_name._M_len = (size_t)name._M_dataplus._M_p;
  bVar2 = IsForbiddenKotlin((java *)name._M_string_length,field_name);
  if (bVar2) {
    local_40 = name._M_string_length;
    local_38 = name._M_dataplus._M_p;
    local_70.piece_ = absl::lts_20250127::NullSafeStringView("_");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,&local_70);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&name);
  }
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinFactoryName(
    const Descriptor* descriptor) {
  std::string name = ToCamelCase(descriptor->name(), /* lower_first = */ true);
  return IsForbiddenKotlin(name) ? absl::StrCat(name, "_") : name;
}